

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O1

double Catch::Benchmark::Detail::weighted_average_quantile(int k,int q,iterator first,iterator last)

{
  long lVar1;
  double *pdVar2;
  ulong uVar3;
  double *pdVar4;
  double *pdVar5;
  long lVar6;
  double dVar7;
  double dVar8;
  
  uVar3 = (long)last._M_current - (long)first._M_current >> 3;
  dVar7 = (double)(long)((long)k * (uVar3 - 1)) / (double)q;
  dVar8 = dVar7 - (double)(int)dVar7;
  lVar6 = (long)(int)dVar7;
  pdVar4 = first._M_current + lVar6;
  if ((last._M_current != first._M_current) && (pdVar4 != last._M_current)) {
    lVar1 = 0x3f;
    if (uVar3 != 0) {
      for (; uVar3 >> lVar1 == 0; lVar1 = lVar1 + -1) {
      }
    }
    std::
    __introselect<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
              (first._M_current,pdVar4,last._M_current,((uint)lVar1 ^ 0x3f) * 2 ^ 0x7e);
  }
  dVar7 = *pdVar4;
  if ((dVar8 != 0.0) || (NAN(dVar8))) {
    pdVar5 = first._M_current + lVar6 + 1;
    pdVar4 = first._M_current + lVar6 + 2;
    if (pdVar4 != last._M_current && pdVar5 != last._M_current) {
      do {
        pdVar2 = pdVar4;
        if (*pdVar5 < *pdVar4 || *pdVar5 == *pdVar4) {
          pdVar2 = pdVar5;
        }
        pdVar5 = pdVar2;
        pdVar4 = pdVar4 + 1;
      } while (pdVar4 != last._M_current);
    }
    dVar7 = dVar8 * (*pdVar5 - dVar7) + dVar7;
  }
  return dVar7;
}

Assistant:

double weighted_average_quantile(int k, int q, std::vector<double>::iterator first, std::vector<double>::iterator last) {
                auto count = last - first;
                double idx = (count - 1) * k / static_cast<double>(q);
                int j = static_cast<int>(idx);
                double g = idx - j;
                std::nth_element(first, first + j, last);
                auto xj = first[j];
                if ( directCompare( g, 0 ) ) {
                    return xj;
                }

                auto xj1 = *std::min_element(first + (j + 1), last);
                return xj + g * (xj1 - xj);
            }